

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O0

void xmrig::cryptonight_single_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  __m128i bx0_00;
  __m128i bx1_00;
  undefined1 auVar5 [16];
  __m128i *palVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong b;
  uint64_t uVar9;
  long *in_RCX;
  uint8_t *in_RDX;
  ulong uVar10;
  __m128i *in_RDI;
  longlong in_R8;
  __m128i *in_R9;
  ulong extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i ax0_00;
  __m128i chunk3;
  __m128i chunk2;
  __m128i chunk1;
  uint64_t division_result;
  uint64_t cx_1;
  uint32_t d;
  uint64_t cx_0;
  uint64_t sqrt_result;
  uint64_t ch;
  uint64_t cl;
  uint64_t lo;
  uint64_t hi;
  __m128i ax0;
  __m128i cx;
  size_t i;
  __m128i bx1;
  __m128i bx0;
  uint64_t idx0;
  uint64_t ah0;
  uint64_t al0;
  __m128i sqrt_result_xmm_0;
  __m128i division_result_xmm_0;
  uint8_t *l0;
  uint64_t *h0;
  uint32_t iters;
  size_t MASK;
  size_t in_stack_fffffffffffffc48;
  uint8_t *in_stack_fffffffffffffc50;
  long in_stack_fffffffffffffc58;
  long in_stack_fffffffffffffc60;
  int local_368;
  int local_360;
  __m128i *local_340;
  ulong local_338;
  ulong uStack_330;
  undefined1 local_328 [16];
  ulong local_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b8;
  undefined8 uStack_2b0;
  uint8_t *local_2a8;
  ulong *local_2a0;
  uint local_294;
  undefined8 local_290;
  __m128i *local_288;
  long *local_278;
  uint8_t *local_270;
  __m128i *in_stack_fffffffffffffda8;
  
  local_290 = 0xffff0;
  local_288 = in_R9;
  local_278 = in_RCX;
  local_270 = in_RDX;
  uVar7 = CnAlgo::iterations((CnAlgo *)
                             &cryptonight_single_hash<false>(unsigned_char_const*,unsigned_long,unsigned_char*,cryptonight_ctx**,unsigned_long,unsigned_long)
                              ::props);
  local_294 = (uint)((long)*local_288 + (ulong)uVar7 >> 1);
  keccak(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,(uint8_t *)0x25e316);
  cn_explode_scratchpad<false>(in_stack_fffffffffffffda8,in_RDI);
  local_2a0 = (ulong *)*local_278;
  local_2a8 = *(uint8_t **)(*local_278 + 0xe0);
  local_2b8 = local_2a0[0xc];
  uStack_2b0 = 0;
  local_2c8 = local_2a0[0xd];
  uStack_2c0 = 0;
  fesetround(0x400);
  local_2d0 = *local_2a0 ^ local_2a0[4];
  local_2d8 = local_2a0[1] ^ local_2a0[5];
  uStack_2f0 = local_2a0[3] ^ local_2a0[7];
  local_2f8 = local_2a0[2] ^ local_2a0[6];
  uStack_300 = local_2a0[9] ^ local_2a0[0xb];
  local_308 = local_2a0[8] ^ local_2a0[10];
  palVar6 = local_340;
  for (local_310 = 0; local_340 = palVar6, local_2e0 = local_2d0, local_310 < local_294;
      local_310 = local_310 + 1) {
    local_338 = local_2d0;
    uStack_330 = local_2d8;
    auVar5._8_8_ = local_2d8;
    auVar5._0_8_ = local_2d0;
    local_328 = aesenc(*(undefined1 (*) [16])(local_2a8 + ((uint)local_2d0 & 0xffff0)),auVar5);
    uVar10 = (ulong)((uint)local_2d0 & 0xffff0);
    bx0_00[1] = (longlong)in_stack_fffffffffffffc50;
    bx0_00[0] = in_stack_fffffffffffffc48;
    bx1_00[1] = in_stack_fffffffffffffc60;
    bx1_00[0] = in_stack_fffffffffffffc58;
    ax0_00[1] = in_R8;
    ax0_00[0] = (longlong)local_328;
    cryptonight_monero_tweak
              ((uint64_t *)(local_2a8 + uVar10),local_2a8,uVar10,ax0_00,bx0_00,bx1_00,in_R9);
    local_2e0 = local_328._0_8_;
    uVar10 = *(ulong *)(local_2a8 + (local_328._0_8_ & 0xffff0) + 8);
    b = *(ulong *)(local_2a8 + (local_328._0_8_ & 0xffff0)) ^ local_2b8 ^ local_2c8 << 0x20;
    local_368 = local_328._0_4_;
    local_360 = (int)local_2c8;
    uVar8 = local_368 + local_360 * 2 | 0x80000001;
    local_2b8 = (ulong)local_328._8_8_ / (ulong)uVar8 & 0xffffffff |
                (ulong)local_328._8_8_ % (ulong)uVar8 << 0x20;
    uStack_2b0 = 0;
    int_sqrt_v2(local_328._0_8_ + local_2b8);
    local_2c8 = extraout_XMM0_Qa;
    uStack_2c0 = extraout_XMM0_Qb;
    uVar9 = __umul128(local_2e0,b,(uint64_t *)&local_340);
    uVar3 = *(ulong *)(local_2a8 + ((ulong)((uint)local_2e0 & 0xffff0) ^ 0x10));
    uVar4 = *(ulong *)((long)(local_2a8 + ((ulong)((uint)local_2e0 & 0xffff0) ^ 0x10)) + 8);
    in_stack_fffffffffffffc58 = *(long *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x20));
    in_stack_fffffffffffffc60 = *(long *)((long)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x20)) + 8);
    uVar1 = *(ulong *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x20));
    uVar2 = *(ulong *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x20) + 8);
    in_stack_fffffffffffffc48 = *(size_t *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x30));
    in_stack_fffffffffffffc50 = *(uint8_t **)((long)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x30)) + 8);
    *(size_t *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x10)) = in_stack_fffffffffffffc48 + local_308;
    *(uint8_t **)((long)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x10)) + 8) =
         in_stack_fffffffffffffc50 + uStack_300;
    *(ulong *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x20)) = (uVar3 ^ (ulong)local_340) + local_2f8;
    *(ulong *)((long)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x20)) + 8) = (uVar4 ^ uVar9) + uStack_2f0;
    *(ulong *)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x30)) = in_stack_fffffffffffffc58 + local_338;
    *(ulong *)((long)(local_2a8 + (local_2e0 & 0xffff0 ^ 0x30)) + 8) =
         in_stack_fffffffffffffc60 + uStack_330;
    local_2d0 = (long)*(__m128i *)(uVar1 ^ (ulong)local_340) + local_2d0;
    local_2d8 = (uVar2 ^ uVar9) + local_2d8;
    *(ulong *)(local_2a8 + (local_2e0 & 0xffff0)) = local_2d0;
    *(ulong *)(local_2a8 + (local_2e0 & 0xffff0) + 8) = local_2d8;
    local_2d0 = b ^ local_2d0;
    local_2d8 = uVar10 ^ local_2d8;
    local_308 = local_2f8;
    uStack_300 = uStack_2f0;
    local_2f8 = local_328._0_8_;
    uStack_2f0 = local_328._8_8_;
    palVar6 = (__m128i *)(uVar1 ^ (ulong)local_340);
    in_stack_fffffffffffffda8 = local_340;
  }
  cn_implode_scratchpad<false>(in_stack_fffffffffffffda8,in_RDI);
  keccakf(local_2a0,0x18);
  (*extra_hashes[(int)(*(byte *)*local_278 & 3)])((uint8_t *)*local_278,200,local_270);
  return;
}

Assistant:

inline void cryptonight_single_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input, size, ctx[0]->state);
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->state), reinterpret_cast<__m128i *>(ctx[0]->memory));

    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint8_t *l0   = ctx[0]->memory;

    VARIANT2_INIT(0);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t al0  = h0[0] ^ h0[4];
    uint64_t ah0  = h0[1] ^ h0[5];
    uint64_t idx0 = al0;
    __m128i bx0   = _mm_set_epi64x(static_cast<int64_t>(h0[3] ^ h0[7]), static_cast<int64_t>(h0[2] ^ h0[6]));
    __m128i bx1   = _mm_set_epi64x(static_cast<int64_t>(h0[9] ^ h0[11]), static_cast<int64_t>(h0[8] ^ h0[10]));

    for (size_t i = 0; i < iters; i++) {
        __m128i cx;
        if (!SOFT_AES) {
            cx = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(static_cast<int64_t>(ah0), static_cast<int64_t>(al0));
        if (SOFT_AES) {
            cx = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx = _mm_aesenc_si128(cx, ax0);
        }

        cryptonight_monero_tweak(reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]), l0, idx0 & MASK, ax0, bx0, bx1, cx);

        idx0 = static_cast<uint64_t>(_mm_cvtsi128_si64(cx));

        uint64_t hi, lo, cl, ch;
        cl = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[0];
        ch = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[1];

        VARIANT2_INTEGER_MATH(0, cl, cx);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx0, bx1, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[0] = al0;
        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;
        bx1 = bx0;

        bx0 = cx;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->memory), reinterpret_cast<__m128i *>(ctx[0]->state));
    keccakf(h0, 24);
    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
}